

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(void)

{
  uint uVar1;
  uint local_10 [2];
  int num;
  
  local_10[1] = 0;
  printf("Enter an integer: ");
  __isoc99_scanf("%i",local_10);
  uVar1 = absolute_value(local_10[0]);
  printf("The absolute value of %i is %i.\n",(ulong)local_10[0],(ulong)uVar1);
  return 0;
}

Assistant:

int main() {

    int num;

    printf("Enter an integer: ");
    scanf("%i", &num);

    printf("The absolute value of %i is %i.\n", num, absolute_value(num));

    return 0;
}